

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_sort.c
# Opt level: O1

void linkedlist_sort(s_linkedlist *linked_list,f_comparator comparator)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  s_linkedlist_node *psVar4;
  s_linkedlist_node *psVar5;
  s_linkedlist_node *psVar6;
  
  psVar6 = (s_linkedlist_node *)0x0;
  do {
    psVar5 = linked_list->head;
    psVar4 = psVar5->next;
    if (psVar4 == psVar6) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
      do {
        iVar3 = (*comparator)(psVar5->element,psVar4->element);
        if (0 < iVar3) {
          psVar4 = psVar5->next;
          pvVar1 = psVar5->element;
          psVar5->element = psVar4->element;
          psVar4->element = pvVar1;
          bVar2 = true;
        }
        psVar5 = psVar5->next;
        psVar4 = psVar5->next;
      } while (psVar4 != psVar6);
      bVar2 = !bVar2;
    }
    psVar6 = psVar5;
  } while (!bVar2);
  return;
}

Assistant:

void linkedlist_sort(s_linkedlist *linked_list, f_comparator comparator) {
    s_linkedlist_node *node   = NULL;
    s_linkedlist_node *lptr   = NULL;
    int               swapped = 0;

    do {
        node    = linked_list->head;
        swapped = 0;

        while (node->next != lptr) {
            if (comparator(node->element, node->next->element) > 0) {
                linkedlistnode_swap(node, node->next);
                swapped = 1;
            }

            node = node->next;
        }

        lptr = node;
    } while (swapped);
}